

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_struct_tests.cpp
# Opt level: O1

void __thiscall
graph_tests::PathFindingOnMap_ManualBFS_Test::PathFindingOnMap_ManualBFS_Test
          (PathFindingOnMap_ManualBFS_Test *this)

{
  _Rb_tree_header *p_Var1;
  
  testing::Test::Test((Test *)this);
  (this->super_PathFindingOnMap).answer_._M_dataplus._M_p =
       (pointer)&(this->super_PathFindingOnMap).answer_.field_2;
  (this->super_PathFindingOnMap).answer_._M_string_length = 0;
  (this->super_PathFindingOnMap).answer_.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->super_PathFindingOnMap).graph_.edges_._M_t._M_impl.super__Rb_tree_header;
  (this->super_PathFindingOnMap).graph_.edges_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_PathFindingOnMap).graph_.edges_._M_t._M_impl.super__Rb_tree_header._M_header
   + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_PathFindingOnMap).graph_.edges_._M_t._M_impl.super__Rb_tree_header._M_header
   + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_PathFindingOnMap).graph_.edges_._M_t._M_impl.super__Rb_tree_header._M_header
   + 0x18) = p_Var1;
  (this->super_PathFindingOnMap).graph_.edges_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_PathFindingOnMap).graph_.nodes_._M_t._M_impl.super__Rb_tree_header;
  (this->super_PathFindingOnMap).graph_.nodes_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_PathFindingOnMap).graph_.nodes_._M_t._M_impl.super__Rb_tree_header._M_header
   + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_PathFindingOnMap).graph_.nodes_._M_t._M_impl.super__Rb_tree_header._M_header
   + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_PathFindingOnMap).graph_.nodes_._M_t._M_impl.super__Rb_tree_header._M_header
   + 0x18) = p_Var1;
  (this->super_PathFindingOnMap).graph_.nodes_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_PathFindingOnMap).super_TestWithParam<graph_tests::PathFindingOnMapCase>.super_Test.
  _vptr_Test = (_func_int **)&PTR__PathFindingOnMap_00176e40;
  (this->super_PathFindingOnMap).super_TestWithParam<graph_tests::PathFindingOnMapCase>.
  super_WithParamInterface<graph_tests::PathFindingOnMapCase>._vptr_WithParamInterface =
       (_func_int **)&PTR__PathFindingOnMap_ManualBFS_Test_00176e80;
  return;
}

Assistant:

TEST_P(PathFindingOnMap, ManualBFS) {
  const PointOnMap finish = GetFinish();
  std::queue<PointOnMap> q;
  q.push(finish);
  std::set<PointOnMap> visited;
  std::map<PointOnMap, BFSPathPoint> bfs_path;
  while (!q.empty()) {
    const PointOnMap u = q.front();
    q.pop();
    if (visited.find(u) != visited.end())
      continue;
    visited.insert(u);
    for (const PointOnMap& v : graph_.Neighbors(u)) {
      if (visited.find(v) == visited.end()) {
        q.push(v);
        if (u.i < v.i)
          bfs_path.emplace(v, BFSPathPoint(u, 'U'));
        else if (u.i > v.i)
          bfs_path.emplace(v, BFSPathPoint(u, 'D'));
        else if (u.j < v.j)
          bfs_path.emplace(v, BFSPathPoint(u, 'L'));
        else if (u.j > v.j)
          bfs_path.emplace(v, BFSPathPoint(u, 'R'));
      }
    }
  }
  const PointOnMap start = GetStart();
  if (visited.find(start) != visited.end()) {
    PointOnMap u = start;
    do {
      answer_.push_back(bfs_path.find(u)->second.type);
      u = bfs_path.find(u)->second.point;
    } while (u != finish);
  }
}